

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::DefaultPrintTo<std::array<int,10ul>>(long param_1,ostream *param_2)

{
  long lVar1;
  char local_2d [5];
  
  local_2d[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(param_2,local_2d + 2,1);
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      local_2d[0] = ',';
      std::__ostream_insert<char,std::char_traits<char>>(param_2,local_2d,1);
    }
    local_2d[1] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(param_2,local_2d + 1,1);
    std::ostream::operator<<((ostream *)param_2,*(int *)(param_1 + lVar1));
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x28);
  local_2d[3] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(param_2,local_2d + 3,1);
  local_2d[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(param_2,local_2d + 4,1);
  return;
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}